

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libc_wrappers.c
# Opt level: O1

char * add_to_buffer(char *str,int fd,int *pos,char *buffer,int buffer_size,int *num_printed,
                    int print_percent)

{
  char cVar1;
  undefined4 in_register_00000084;
  
  cVar1 = *str;
  if (cVar1 != '\0') {
    do {
      if ((int)num_printed == 0 && cVar1 == '%') {
        return str;
      }
      if ((long)*pos < 0x1000) {
        buffer[*pos] = cVar1;
      }
      else {
        syscall(1,(ulong)(uint)fd,buffer,0x1000);
        *(int *)CONCAT44(in_register_00000084,buffer_size) =
             *(int *)CONCAT44(in_register_00000084,buffer_size) + 0x1000;
        *pos = 0;
      }
      *pos = *pos + 1;
      cVar1 = str[1];
      str = str + 1;
    } while (cVar1 != '\0');
  }
  return str;
}

Assistant:

static const char *add_to_buffer(const char *str, int fd, int *pos,
                                 char *buffer, int buffer_size,
                                 int *num_printed, int print_percent) {
  for (; *str && (print_percent || *str != '%'); str++) {
    if (*pos >= buffer_size) {  // GCOVR_EXCL_START
      gotcha_write(fd, buffer, buffer_size);
      *num_printed += buffer_size;
      *pos = 0;
    }  // GCOVR_EXCL_STOP
    else {
      buffer[*pos] = *str;
    }
    *pos = *pos + 1;
  }
  return str;
}